

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O2

bool __thiscall
CommandLineArguments::setOutputType(CommandLineArguments *this,int ac,char **av,int *i)

{
  bool bVar1;
  OutputType OVar2;
  size_t sVar3;
  int ac_00;
  SimpleString SStack_58;
  SimpleString outputType;
  SimpleString local_38;
  
  ac_00 = 0x1448d7;
  SimpleString::SimpleString(&SStack_58,"-o");
  getParameterField((CommandLineArguments *)&outputType,ac_00,(char **)(ulong)(uint)ac,(int *)av,
                    (SimpleString *)i);
  SimpleString::~SimpleString(&SStack_58);
  sVar3 = SimpleString::size(&outputType);
  if (sVar3 == 0) {
LAB_0013cc0f:
    bVar1 = false;
  }
  else {
    SimpleString::SimpleString(&SStack_58,"normal");
    bVar1 = operator==(&outputType,&SStack_58);
    if (bVar1) {
      SimpleString::~SimpleString(&SStack_58);
      OVar2 = OUTPUT_ECLIPSE;
    }
    else {
      SimpleString::SimpleString(&local_38,"eclipse");
      bVar1 = operator==(&outputType,&local_38);
      SimpleString::~SimpleString(&local_38);
      SimpleString::~SimpleString(&SStack_58);
      OVar2 = OUTPUT_ECLIPSE;
      if (!bVar1) {
        SimpleString::SimpleString(&SStack_58,"junit");
        bVar1 = operator==(&outputType,&SStack_58);
        SimpleString::~SimpleString(&SStack_58);
        if (bVar1) {
          OVar2 = OUTPUT_JUNIT;
        }
        else {
          SimpleString::SimpleString(&SStack_58,"teamcity");
          bVar1 = operator==(&outputType,&SStack_58);
          SimpleString::~SimpleString(&SStack_58);
          if (!bVar1) goto LAB_0013cc0f;
          OVar2 = OUTPUT_TEAMCITY;
        }
      }
    }
    this->outputType_ = OVar2;
    bVar1 = true;
  }
  SimpleString::~SimpleString(&outputType);
  return bVar1;
}

Assistant:

bool CommandLineArguments::setOutputType(int ac, const char *const *av, int& i)
{
    SimpleString outputType = getParameterField(ac, av, i, "-o");
    if (outputType.size() == 0) return false;

    if (outputType == "normal" || outputType == "eclipse") {
        outputType_ = OUTPUT_ECLIPSE;
        return true;
    }
    if (outputType == "junit") {
        outputType_ = OUTPUT_JUNIT;
        return true;
    }
    if (outputType == "teamcity") {
        outputType_ = OUTPUT_TEAMCITY;
        return true;
    }

    return false;
}